

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIntegerStateQueryTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::LegacyVectorLimitCase::iterate
          (LegacyVectorLimitCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  TestLog *pTVar4;
  bool bVar5;
  int iVar6;
  GLenum GVar7;
  undefined4 extraout_var;
  long *plVar8;
  undefined8 *puVar9;
  ulong *puVar10;
  size_type *psVar11;
  ulong uVar12;
  ulong uVar13;
  undefined8 uVar14;
  StateQueryMemoryWriteGuard<int> value;
  ScopedLogSection section;
  CallLogWrapper gl;
  ResultCollector result;
  string local_2f8;
  ulong *local_2d8;
  long local_2d0;
  ulong local_2c8;
  undefined8 uStack_2c0;
  string local_2b8;
  string local_298;
  StateQueryMemoryWriteGuard<int> local_278;
  undefined4 uStack_26c;
  ulong local_268 [2];
  ScopedLogSection local_258;
  CallLogWrapper local_250;
  code *local_238;
  GLenum local_230;
  long local_228 [2];
  Enum<int,_2UL> local_218;
  Enum<int,_2UL> local_208;
  ResultCollector local_1f8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_250,(Functions *)CONCAT44(extraout_var,iVar6),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pcVar3 = local_1a8 + 0x10;
  local_1a8._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8," // ERROR: ","");
  tcu::ResultCollector::ResultCollector(&local_1f8,pTVar4,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar3) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  local_250.m_enableLog = true;
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"TiedTo","");
  local_208.m_value = this->m_legacyTarget;
  local_208.m_getName = glu::getGettableStateName;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  tcu::Format::Enum<int,_2UL>::toStream(&local_208,(ostream *)local_1a8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_238);
  paVar1 = &local_2f8.field_2;
  puVar10 = (ulong *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar10) {
    local_2f8.field_2._M_allocated_capacity = *puVar10;
    local_2f8.field_2._8_8_ = plVar8[3];
    local_2f8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_2f8.field_2._M_allocated_capacity = *puVar10;
    local_2f8._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_2f8._M_string_length = plVar8[1];
  *plVar8 = (long)puVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_218.m_value = this->m_componentTarget;
  local_218.m_getName = glu::getGettableStateName;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  tcu::Format::Enum<int,_2UL>::toStream(&local_218,(ostream *)local_1a8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  uVar13 = CONCAT44(uStack_26c,local_278.m_postguard) + local_2f8._M_string_length;
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar1) {
    uVar14 = local_2f8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < uVar13) {
    uVar12 = 0xf;
    if ((ulong *)local_278._0_8_ != local_268) {
      uVar12 = local_268[0];
    }
    if (uVar12 < uVar13) goto LAB_0152c794;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_278,0,(char *)0x0,(ulong)local_2f8._M_dataplus._M_p);
  }
  else {
LAB_0152c794:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2f8,local_278._0_8_);
  }
  local_2d8 = &local_2c8;
  puVar10 = puVar9 + 2;
  if ((ulong *)*puVar9 == puVar10) {
    local_2c8 = *puVar10;
    uStack_2c0 = puVar9[3];
  }
  else {
    local_2c8 = *puVar10;
    local_2d8 = (ulong *)*puVar9;
  }
  local_2d0 = puVar9[1];
  *puVar9 = puVar10;
  puVar9[1] = 0;
  *(undefined1 *)puVar10 = 0;
  puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d8);
  paVar2 = &local_2b8.field_2;
  psVar11 = puVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_2b8.field_2._M_allocated_capacity = *psVar11;
    local_2b8.field_2._8_8_ = puVar9[3];
    local_2b8._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_2b8.field_2._M_allocated_capacity = *psVar11;
    local_2b8._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_2b8._M_string_length = puVar9[1];
  *puVar9 = psVar11;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  tcu::ScopedLogSection::ScopedLogSection(&local_258,pTVar4,&local_298,&local_2b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if (local_2d8 != &local_2c8) {
    operator_delete(local_2d8,local_2c8 + 1);
  }
  if ((ulong *)local_278._0_8_ != local_268) {
    operator_delete((void *)local_278._0_8_,local_268[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_238 != (code *)local_228) {
    operator_delete(local_238,local_228[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  local_278.m_preguard = -0x21212122;
  local_278.m_value = -0x21212122;
  local_278.m_postguard = -0x21212122;
  glu::CallLogWrapper::glGetIntegerv
            (&local_250,this->m_componentTarget,(GLint *)((long)&local_278 + 4));
  GVar7 = glu::CallLogWrapper::glGetError(&local_250);
  if (GVar7 == 0) goto LAB_0152cb70;
  local_2d8 = &local_2c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"Got Error ","");
  local_238 = glu::getErrorName;
  local_230 = GVar7;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_2f8,&local_238);
  uVar13 = 0xf;
  if (local_2d8 != &local_2c8) {
    uVar13 = local_2c8;
  }
  if (uVar13 < local_2f8._M_string_length + local_2d0) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != paVar1) {
      uVar14 = local_2f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_2f8._M_string_length + local_2d0) goto LAB_0152c9cc;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_2f8,0,(char *)0x0,(ulong)local_2d8);
  }
  else {
LAB_0152c9cc:
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2d8,(ulong)local_2f8._M_dataplus._M_p);
  }
  psVar11 = puVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_2b8.field_2._M_allocated_capacity = *psVar11;
    local_2b8.field_2._8_8_ = puVar9[3];
    local_2b8._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_2b8.field_2._M_allocated_capacity = *psVar11;
    local_2b8._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_2b8._M_string_length = puVar9[1];
  *puVar9 = psVar11;
  puVar9[1] = 0;
  *(undefined1 *)psVar11 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_2b8);
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  psVar11 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_298.field_2._M_allocated_capacity = *psVar11;
    local_298.field_2._8_8_ = plVar8[3];
  }
  else {
    local_298.field_2._M_allocated_capacity = *psVar11;
    local_298._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_298._M_string_length = plVar8[1];
  *plVar8 = (long)psVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_298);
  psVar11 = (size_type *)(plVar8 + 2);
  if ((size_type *)*plVar8 == psVar11) {
    local_1a8._16_8_ = *psVar11;
    local_1a8._24_8_ = plVar8[3];
    local_1a8._0_8_ = pcVar3;
  }
  else {
    local_1a8._16_8_ = *psVar11;
    local_1a8._0_8_ = (size_type *)*plVar8;
  }
  local_1a8._8_8_ = plVar8[1];
  *plVar8 = (long)psVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  tcu::ResultCollector::fail(&local_1f8,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar3) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_2d8 != &local_2c8) {
    operator_delete(local_2d8,local_2c8 + 1);
  }
LAB_0152cb70:
  bVar5 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    (&local_278,&local_1f8);
  if (bVar5) {
    iVar6 = local_278.m_value + 3;
    if (-1 < (long)local_278._0_8_) {
      iVar6 = local_278.m_value;
    }
    deqp::gls::StateQueryUtil::verifyStateInteger
              (&local_1f8,&local_250,this->m_legacyTarget,iVar6 >> 2,this->m_verifierType);
  }
  tcu::TestLog::endSection(local_258.m_log);
  tcu::ResultCollector::setTestContextResult
            (&local_1f8,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_message._M_dataplus._M_p != &local_1f8.m_message.field_2) {
    operator_delete(local_1f8.m_message._M_dataplus._M_p,
                    local_1f8.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_prefix._M_dataplus._M_p != &local_1f8.m_prefix.field_2) {
    operator_delete(local_1f8.m_prefix._M_dataplus._M_p,
                    local_1f8.m_prefix.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::~CallLogWrapper(&local_250);
  return STOP;
}

Assistant:

LegacyVectorLimitCase::IterateResult LegacyVectorLimitCase::iterate (void)
{
	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	{
		const tcu::ScopedLogSection	section(m_testCtx.getLog(), "TiedTo", de::toString(glu::getGettableStateStr(m_legacyTarget)) +
																			" is " +
																			de::toString(glu::getGettableStateStr(m_componentTarget)) +
																			" divided by four");

		StateQueryMemoryWriteGuard<glw::GLint> value;
		gl.glGetIntegerv(m_componentTarget, &value);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGetIntegerv");

		if (value.verifyValidity(result))
			verifyStateInteger(result, gl, m_legacyTarget, ((int)value) / 4, m_verifierType);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}